

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::UnnestBindData::Copy(UnnestBindData *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  LogicalType local_30;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  LogicalType::LogicalType(&local_30,(LogicalType *)(in_RSI + 8));
  *pp_Var1 = (_func_int *)&PTR__UnnestBindData_0249d5a0;
  LogicalType::LogicalType((LogicalType *)(pp_Var1 + 1),&local_30);
  LogicalType::~LogicalType(&local_30);
  (this->super_FunctionData)._vptr_FunctionData = pp_Var1;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<UnnestBindData>(input_type);
	}